

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

ChGenotype * __thiscall
chrono::ChOptimizerGenetic::Select_best(ChOptimizerGenetic *this,ChGenotype **my_population)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ChGenotype *pCVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  pCVar4 = *my_population;
  lVar5 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
  if (0 < lVar5) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = pCVar4->fitness;
    lVar6 = 0;
    auVar10._8_8_ = 0x7fffffffffffffff;
    auVar10._0_8_ = 0x7fffffffffffffff;
    do {
      dVar1 = my_population[lVar6]->fitness;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar1;
      auVar8 = vandpd_avx(auVar11,auVar10);
      uVar2 = vcmppd_avx512vl(auVar8,ZEXT816(0x412e847e00000000),4);
      uVar3 = vcmppd_avx512vl(auVar9,auVar11,1);
      bVar7 = (bool)((byte)uVar2 & 3 & (byte)uVar3 & 1);
      if (bVar7 != false) {
        pCVar4 = my_population[lVar6];
      }
      auVar8._0_8_ = (ulong)bVar7 * (long)dVar1 + (ulong)!bVar7 * auVar9._0_8_;
      auVar8._8_8_ = auVar9._8_8_;
      lVar6 = lVar6 + 1;
      auVar9 = auVar8;
    } while (lVar5 != lVar6);
  }
  return pCVar4;
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_best(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];
    double mbestfitness = my_population[0]->fitness;

    for (int i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE)
            if (my_population[i]->fitness > mbestfitness) {
                mselected = my_population[i];
                mbestfitness = my_population[i]->fitness;
            }
    }
    // default .
    return mselected;
}